

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.cpp
# Opt level: O2

void alBufferSamplesSOFT(ALuint param_1,ALuint param_2,ALenum param_3,ALsizei param_4,ALenum param_5
                        ,ALenum param_6,ALvoid *param_7)

{
  intrusive_ptr<ALCcontext> local_10;
  
  GetContextRef();
  if (local_10.mPtr != (ALCcontext *)0x0) {
    ALCcontext::setError(local_10.mPtr,0xa004,"alBufferSamplesSOFT not supported");
  }
  al::intrusive_ptr<ALCcontext>::~intrusive_ptr(&local_10);
  return;
}

Assistant:

END_API_FUNC


AL_API void AL_APIENTRY alBufferSamplesSOFT(ALuint /*buffer*/, ALuint /*samplerate*/,
    ALenum /*internalformat*/, ALsizei /*samples*/, ALenum /*channels*/, ALenum /*type*/,
    const ALvoid* /*data*/)
START_API_FUNC
{
    ContextRef context{GetContextRef()};
    if UNLIKELY(!context) return;

    context->setError(AL_INVALID_OPERATION, "alBufferSamplesSOFT not supported");
}